

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void parsespectype(rnndb *db,char *file,xmlNode *node)

{
  int iVar1;
  rnnspectype *prVar2;
  char *pcVar3;
  rnnspectype **pprVar4;
  xmlNode *local_40;
  xmlNode *chain;
  _xmlAttr *p_Stack_30;
  int i;
  xmlAttr *attr;
  rnnspectype *res;
  xmlNode *node_local;
  char *file_local;
  rnndb *db_local;
  
  prVar2 = (rnnspectype *)calloc(0x90,1);
  prVar2->file = file;
  for (p_Stack_30 = node->properties; p_Stack_30 != (xmlAttr *)0x0; p_Stack_30 = p_Stack_30->next) {
    iVar1 = strcmp((char *)p_Stack_30->name,"name");
    if (iVar1 == 0) {
      pcVar3 = getattrib(db,file,(uint)node->line,p_Stack_30);
      pcVar3 = strdup(pcVar3);
      prVar2->name = pcVar3;
    }
    else {
      iVar1 = trytypeattr(db,file,node,p_Stack_30,&prVar2->typeinfo);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for spectype\n",file,(ulong)node->line,
                p_Stack_30->name);
        db->estatus = 1;
      }
    }
  }
  if (prVar2->name == (char *)0x0) {
    fprintf(_stderr,"%s:%d: nameless spectype\n",file,(ulong)node->line);
    db->estatus = 1;
  }
  else {
    for (chain._4_4_ = 0; chain._4_4_ < db->spectypesnum; chain._4_4_ = chain._4_4_ + 1) {
      iVar1 = strcmp(db->spectypes[chain._4_4_]->name,prVar2->name);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: duplicated spectype name %s\n",file,(ulong)node->line,prVar2->name);
        db->estatus = 1;
        return;
      }
    }
    if (db->spectypesmax <= db->spectypesnum) {
      if (db->spectypesmax == 0) {
        db->spectypesmax = 0x10;
      }
      else {
        db->spectypesmax = db->spectypesmax << 1;
      }
      pprVar4 = (rnnspectype **)realloc(db->spectypes,(long)db->spectypesmax << 3);
      db->spectypes = pprVar4;
    }
    iVar1 = db->spectypesnum;
    db->spectypesnum = iVar1 + 1;
    db->spectypes[iVar1] = prVar2;
    for (local_40 = node->children; local_40 != (xmlNode *)0x0; local_40 = local_40->next) {
      if ((((local_40->type == XML_ELEMENT_NODE) &&
           (iVar1 = trytypetag(db,file,local_40,&prVar2->typeinfo), iVar1 == 0)) &&
          (iVar1 = trytop(db,file,local_40), iVar1 == 0)) &&
         (iVar1 = trydoc(db,file,local_40), iVar1 == 0)) {
        fprintf(_stderr,"%s:%d: wrong tag in spectype: <%s>\n",file,(ulong)local_40->line,
                local_40->name);
        db->estatus = 1;
      }
    }
  }
  return;
}

Assistant:

static void parsespectype(struct rnndb *db, char *file, xmlNode *node) {
	struct rnnspectype *res = calloc (sizeof *res, 1);
	res->file = file;
	xmlAttr *attr = node->properties;
	int i;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			res->name = strdup(getattrib(db, file, node->line, attr));
		} else if (!trytypeattr(db, file, node, attr, &res->typeinfo)) {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for spectype\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	if (!res->name) {
		fprintf (stderr, "%s:%d: nameless spectype\n", file, node->line);
		db->estatus = 1;
		return;
	}
	for (i = 0; i < db->spectypesnum; i++)
		if (!strcmp(db->spectypes[i]->name, res->name)) {
			fprintf (stderr, "%s:%d: duplicated spectype name %s\n", file, node->line, res->name);
			db->estatus = 1;
			return;
		}
	ADDARRAY(db->spectypes, res);
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!trytypetag(db, file, chain, &res->typeinfo) && !trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in spectype: <%s>\n", file, chain->line, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
}